

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O3

double extract_spC<PredictionData<float,unsigned_long>>
                 (PredictionData<float,_unsigned_long> *prediction_data,size_t row,size_t col_num)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  puVar1 = prediction_data->Xc_ind;
  uVar2 = prediction_data->Xc_indptr[col_num];
  uVar3 = prediction_data->Xc_indptr[col_num + 1];
  puVar4 = puVar1 + uVar2;
  uVar5 = (long)(uVar3 * 8 + uVar2 * -8) >> 3;
  while (0 < (long)uVar5) {
    uVar6 = uVar5 >> 1;
    uVar7 = ~uVar6 + uVar5;
    uVar5 = uVar6;
    if (puVar4[uVar6] < row) {
      puVar4 = puVar4 + uVar6 + 1;
      uVar5 = uVar7;
    }
  }
  dVar8 = 0.0;
  if ((puVar4 != puVar1 + uVar3) && (*puVar4 == row)) {
    dVar8 = (double)*(float *)((long)prediction_data->Xc + ((long)puVar4 - (long)puVar1 >> 1));
  }
  return dVar8;
}

Assistant:

double extract_spC(const PredictionData &prediction_data, size_t row, size_t col_num) noexcept
{
    const decltype(prediction_data.Xc_indptr)
               search_res = std::lower_bound(prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num],
                                             prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1],
                                             row);
    if (
        search_res == (prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1])
            ||
        (*search_res) != static_cast<typename std::remove_pointer<decltype(search_res)>::type>(row)
        )
        return 0.;
    else
        return prediction_data.Xc[search_res - prediction_data.Xc_ind];
}